

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void do_cmd_knowledge_runes(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  undefined1 auVar1 [32];
  _Bool _Var2;
  wchar_t wVar3;
  int *obj_list;
  long lVar4;
  wchar_t o_count;
  ulong uVar5;
  size_t i;
  char buf [30];
  
  wVar3 = max_runes();
  obj_list = (int *)mem_zalloc((long)wVar3 * 4);
  i = 0;
  uVar5 = (ulong)(uint)wVar3;
  if (wVar3 < L'\x01') {
    uVar5 = i;
  }
  o_count = L'\0';
  for (; uVar5 != i; i = i + 1) {
    _Var2 = player_knows_rune(player,i);
    if (_Var2) {
      lVar4 = (long)o_count;
      o_count = o_count + L'\x01';
      obj_list[lVar4] = (int)i;
    }
  }
  strnfmt(buf,0x1e,"runes (%d unknown)",(ulong)(uint)(wVar3 - o_count));
  g_funcs.gcomp = (_func_wchar_t_void_ptr_void_ptr *)0x0;
  g_funcs.name = rune_var_name;
  g_funcs.group = rune_var;
  g_funcs.summary = (_func_void_wchar_t_wchar_t_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)0x0;
  g_funcs.maxnum = L'\b';
  g_funcs.easy_know = false;
  g_funcs._37_3_ = 0;
  auVar1 = ZEXT1632(CONCAT88(rune_lore,display_rune));
  o_funcs.xtra_prompt = rune_xtra_prompt;
  o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)auVar1._0_8_;
  o_funcs.lore = (_func_void_wchar_t *)auVar1._8_8_;
  o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)auVar1._16_8_;
  o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)auVar1._24_8_;
  o_funcs.xtra_act = rune_xtra_act;
  o_funcs._48_8_ = 0;
  display_knowledge(buf,obj_list,o_count,g_funcs,o_funcs,"Inscribed");
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_runes(const char *name, int row)
{
	group_funcs rune_var_f = {rune_var_name, NULL, rune_var, 0,
							  N_ELEMENTS(rune_group_text), false};

	member_funcs rune_f = {display_rune, rune_lore, NULL, NULL,
						   rune_xtra_prompt, rune_xtra_act, 0};

	int *runes;
	int rune_max = max_runes();
	int count = 0;
	int i;
	char buf[30];

	runes = mem_zalloc(rune_max * sizeof(int));

	for (i = 0; i < rune_max; i++) {
		/* Ignore unknown runes */
		if (!player_knows_rune(player, i))
			continue;

		runes[count++] = i;
	}

	strnfmt(buf, sizeof(buf), "runes (%d unknown)", rune_max - count);

	display_knowledge(buf, runes, count, rune_var_f, rune_f, "Inscribed");
	mem_free(runes);
}